

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raytraced_renderer.cpp
# Opt level: O2

void __thiscall CGL::RaytracedRenderer::clear(RaytracedRenderer *this)

{
  BVHAccel *this_00;
  
  if (this->state == READY) {
    this_00 = this->bvh;
    if (this_00 != (BVHAccel *)0x0) {
      CGL::SceneObjects::BVHAccel::~BVHAccel(this_00);
    }
    operator_delete(this_00);
    this->bvh = (BVHAccel *)0x0;
    this->scene = (Scene *)0x0;
    this->camera = (Camera *)0x0;
    std::deque<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>::
    pop_back(&(this->selectionHistory).c);
    ImageBuffer::resize(&this->frameBuffer,0,0);
    this->state = INIT;
    (this->super_OfflineRenderer).render_cell = false;
    CGL::PathTracer::clear();
    return;
  }
  return;
}

Assistant:

void RaytracedRenderer::clear() {
  if (state != READY) return;
  delete bvh;
  bvh = NULL;
  scene = NULL;
  camera = NULL;
  selectionHistory.pop();
  frameBuffer.resize(0, 0);
  state = INIT;
  render_cell = false;

  pt->clear();
}